

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_debug_ostream.h
# Opt level: O0

void __thiscall WifiDebugOstream::onechar(WifiDebugOstream *this,char c)

{
  bool bVar1;
  char local_11;
  bool isNewLine;
  WifiDebugOstream *pWStack_10;
  char c_local;
  WifiDebugOstream *this_local;
  
  local_11 = c;
  pWStack_10 = this;
  (**this->m_serialDebug->_vptr_DebugInterface)(this->m_serialDebug,&local_11,1);
  bVar1 = local_11 == '\n';
  if (((this->m_lastWasNewline & 1U) != 0) && (!bVar1)) {
    operator<<(this->m_wifiDebug,"# ");
  }
  (*this->m_wifiDebug->_vptr_NetInterface[4])(this->m_wifiDebug,&local_11,1);
  this->m_lastWasNewline = bVar1;
  return;
}

Assistant:

void onechar(char c )
  { 
    m_serialDebug->write( &c, 1 );
    bool isNewLine = ( c == '\n' );
    if ( m_lastWasNewline && !isNewLine )
    {
      (*m_wifiDebug) << "# ";
    }
    m_wifiDebug->write( &c, 1 );
    m_lastWasNewline = isNewLine;
  }